

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_reselect(_glist *x)

{
  _gobj **pp_Var1;
  t_selection *ptVar2;
  t_gobj *ptVar3;
  t_gobj *ptVar4;
  _gobj *y;
  
  ptVar2 = x->gl_editor->e_selection;
  if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
    if ((ptVar2 != (t_selection *)0x0) && (ptVar2->sel_next == (_selection *)0x0)) {
      gobj_activate(ptVar2->sel_what,x,1);
      return;
    }
  }
  else {
    ptVar3 = ptVar2->sel_what;
    if ((ptVar3 != (t_gobj *)0x0) && (ptVar2->sel_next == (_selection *)0x0)) {
      canvas_getindex(x,ptVar3);
      glist_noselect(x);
      ptVar4 = x->gl_list;
      y = ptVar4;
      if (ptVar4 != (t_gobj *)0x0) {
        do {
          if (y == ptVar3) {
            glist_select(x,y);
            return;
          }
          pp_Var1 = &y->g_next;
          y = *pp_Var1;
        } while (*pp_Var1 != (_gobj *)0x0);
        while (ptVar3 = ptVar4, ptVar3 != (t_gobj *)0x0) {
          ptVar4 = ptVar3->g_next;
          if (ptVar3->g_next == (_gobj *)0x0) {
            glist_select(x,ptVar3);
            ptVar4 = ptVar3->g_next;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void canvas_reselect(t_canvas *x)
{
    t_gobj *g, *gwas;
        /* if someone is text editing, and if only one object is
           selected,  deselect everyone and reselect.  */
    if (x->gl_editor->e_textedfor)
    {
            /* only do this if exactly one item is selected. */
        if ((gwas = x->gl_editor->e_selection->sel_what) &&
            !x->gl_editor->e_selection->sel_next)
        {
            int nobjwas = glist_getindex(x, 0),
                indx = canvas_getindex(x, x->gl_editor->e_selection->sel_what);
            glist_noselect(x);
            for (g = x->gl_list; g; g = g->g_next)
                if (g == gwas)
                {
                    glist_select(x, g);
                    return;
                }
                /* "gwas" must have disappeared; just search to the last
                   object and select it */
            for (g = x->gl_list; g; g = g->g_next)
                if (!g->g_next)
                    glist_select(x, g);
        }
    }
    else if (x->gl_editor->e_selection &&
             !x->gl_editor->e_selection->sel_next)
            /* otherwise activate first item in selection */
        gobj_activate(x->gl_editor->e_selection->sel_what, x, 1);
}